

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

bool __thiscall httplib::Server::routing(Server *this,Request *req,Response *res)

{
  string *psVar1;
  _Any_data *p_Var2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  bool bVar4;
  int iVar5;
  _Any_data *p_Var6;
  _Any_data *p_Var7;
  
  psVar1 = &req->method;
  iVar5 = std::__cxx11::string::compare((char *)psVar1);
  if ((iVar5 == 0) && (bVar4 = handle_file_request(this,req,res), bVar4)) {
    return true;
  }
  iVar5 = std::__cxx11::string::compare((char *)psVar1);
  if ((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare((char *)psVar1), iVar5 == 0)) {
    p_Var7 = (_Any_data *)
             (this->get_handlers_).
             super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    p_Var2 = (_Any_data *)
             (this->get_handlers_).
             super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (p_Var7 != p_Var2) {
      p_Var7 = (_Any_data *)(p_Var7->_M_pod_data + 0x20);
      do {
        _Var3._M_current = (req->path)._M_dataplus._M_p;
        bVar4 = std::__detail::
                __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                          (_Var3,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  )(_Var3._M_current + (req->path)._M_string_length),&req->matches,
                           (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)(p_Var7 + -2),0);
        if (bVar4) goto LAB_00146c6d;
        p_Var6 = p_Var7 + 2;
        p_Var7 = p_Var7 + 4;
      } while (p_Var6 != p_Var2);
    }
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar5 == 0) {
      p_Var7 = (_Any_data *)
               (this->post_handlers_).
               super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      p_Var2 = (_Any_data *)
               (this->post_handlers_).
               super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (p_Var7 != p_Var2) {
        p_Var7 = (_Any_data *)(p_Var7->_M_pod_data + 0x20);
        do {
          _Var3._M_current = (req->path)._M_dataplus._M_p;
          bVar4 = std::__detail::
                  __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                            (_Var3,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    )(_Var3._M_current + (req->path)._M_string_length),&req->matches
                             ,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)(p_Var7 + -2),
                             0);
          if (bVar4) goto LAB_00146c6d;
          p_Var6 = p_Var7 + 2;
          p_Var7 = p_Var7 + 4;
        } while (p_Var6 != p_Var2);
      }
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar5 == 0) {
        p_Var7 = (_Any_data *)
                 (this->put_handlers_).
                 super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        p_Var2 = (_Any_data *)
                 (this->put_handlers_).
                 super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (p_Var7 != p_Var2) {
          p_Var7 = (_Any_data *)(p_Var7->_M_pod_data + 0x20);
          while (_Var3._M_current = (req->path)._M_dataplus._M_p,
                bVar4 = std::__detail::
                        __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                                  (_Var3,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          )(_Var3._M_current + (req->path)._M_string_length),
                                   &req->matches,
                                   (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                   (p_Var7 + -2),0), !bVar4) {
            p_Var6 = p_Var7 + 2;
            p_Var7 = p_Var7 + 4;
            if (p_Var6 == p_Var2) {
              return false;
            }
          }
LAB_00146c6d:
          if (*(long *)(p_Var7 + 1) != 0) {
            (**(code **)(p_Var7->_M_pod_data + 0x18))(p_Var7,req,res);
            return true;
          }
          std::__throw_bad_function_call();
        }
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar5 == 0) {
          p_Var7 = (_Any_data *)
                   (this->delete_handlers_).
                   super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          p_Var2 = (_Any_data *)
                   (this->delete_handlers_).
                   super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (p_Var7 != p_Var2) {
            p_Var7 = (_Any_data *)(p_Var7->_M_pod_data + 0x20);
            while (_Var3._M_current = (req->path)._M_dataplus._M_p,
                  bVar4 = std::__detail::
                          __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                                    (_Var3,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            )(_Var3._M_current + (req->path)._M_string_length),
                                     &req->matches,
                                     (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                     (p_Var7 + -2),0), !bVar4) {
              p_Var6 = p_Var7 + 2;
              p_Var7 = p_Var7 + 4;
              if (p_Var6 == p_Var2) {
                return false;
              }
            }
            goto LAB_00146c6d;
          }
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)psVar1);
          if (iVar5 == 0) {
            bVar4 = dispatch_request(this,req,res,&this->options_handlers_);
            return bVar4;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

inline bool Server::routing(Request& req, Response& res)
{
    if (req.method == "GET" && handle_file_request(req, res)) {
        return true;
    }

    if (req.method == "GET" || req.method == "HEAD") {
        return dispatch_request(req, res, get_handlers_);
    } else if (req.method == "POST") {
        return dispatch_request(req, res, post_handlers_);
    } else if (req.method == "PUT") {
        return dispatch_request(req, res, put_handlers_);
    } else if (req.method == "DELETE") {
        return dispatch_request(req, res, delete_handlers_);
    } else if (req.method == "OPTIONS") {
        return dispatch_request(req, res, options_handlers_);
    }
    return false;
}